

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::MergeReturnPass::RecordImmediateDominators(MergeReturnPass *this,Function *function)

{
  unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>_>
  *this_00;
  pointer puVar1;
  BasicBlock *A;
  IRContext *this_01;
  Instruction *pIVar2;
  BasicBlock *pBVar3;
  mapped_type *ppIVar4;
  pointer puVar5;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_48;
  MergeReturnPass *local_40;
  DominatorTree *local_38;
  
  local_40 = this;
  local_38 = (DominatorTree *)
             IRContext::GetDominatorAnalysis((this->super_MemPass).super_Pass.context_,function);
  puVar5 = (function->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (function->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    this_00 = &local_40->original_dominator_;
    do {
      A = (puVar5->_M_t).
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      if (A == (BasicBlock *)0x0) {
LAB_00259b02:
        local_48._M_head_impl = A;
        ppIVar4 = std::__detail::
                  _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,&local_48._M_head_impl);
        *ppIVar4 = (mapped_type)0x0;
      }
      else {
        pBVar3 = DominatorTree::ImmediateDominator(local_38,A);
        if (pBVar3 == (BasicBlock *)0x0) goto LAB_00259b02;
        this_01 = (local_40->super_MemPass).super_Pass.context_;
        if ((this_01->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
          IRContext::BuildCFG(this_01);
        }
        if (pBVar3 == &((this_01->cfg_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                        .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
                       pseudo_entry_block_) goto LAB_00259b02;
        pIVar2 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar2 == (Instruction *)0x0) ||
           ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
          __assert_fail("!insts_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                        ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
        }
        pIVar2 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
        local_48._M_head_impl = A;
        ppIVar4 = std::__detail::
                  _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,&local_48._M_head_impl);
        *ppIVar4 = pIVar2;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  return;
}

Assistant:

void MergeReturnPass::RecordImmediateDominators(Function* function) {
  DominatorAnalysis* dom_tree = context()->GetDominatorAnalysis(function);
  for (BasicBlock& bb : *function) {
    BasicBlock* dominator_bb = dom_tree->ImmediateDominator(&bb);
    if (dominator_bb && dominator_bb != cfg()->pseudo_entry_block()) {
      original_dominator_[&bb] = dominator_bb->terminator();
    } else {
      original_dominator_[&bb] = nullptr;
    }
  }
}